

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_exhaustive.c
# Opt level: O3

void r_from_k(secp256k1_scalar *r,secp256k1_ge *group,int k,int *overflow)

{
  uint64_t *puVar1;
  int i;
  int iVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uchar x_bin [32];
  secp256k1_fe x;
  byte local_68 [32];
  secp256k1_fe local_48;
  
  iVar2 = k % 0xd;
  local_48.n[0] = group[iVar2].x.n[0];
  local_48.n[1] = group[iVar2].x.n[1];
  puVar1 = group[iVar2].x.n + 2;
  local_48.n[2] = *puVar1;
  local_48.n[3] = puVar1[1];
  puVar1 = group[iVar2].x.n + 4;
  local_48.n[4] = *puVar1;
  local_48._40_8_ = puVar1[1];
  secp256k1_fe_normalize(&local_48);
  secp256k1_fe_get_b32(local_68,&local_48);
  lVar3 = 0;
  uVar4 = 0;
  do {
    uVar5 = (uint)local_68[lVar3] | uVar4 << 8;
    uVar4 = uVar5 - (uVar5 / 0xd + (uVar5 / 0xd) * 0xc);
    if (uVar5 < 0xd) {
      uVar4 = uVar5;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x20);
  *r = uVar4;
  return;
}

Assistant:

static void r_from_k(secp256k1_scalar *r, const secp256k1_ge *group, int k, int* overflow) {
    secp256k1_fe x;
    unsigned char x_bin[32];
    k %= EXHAUSTIVE_TEST_ORDER;
    x = group[k].x;
    secp256k1_fe_normalize(&x);
    secp256k1_fe_get_b32(x_bin, &x);
    secp256k1_scalar_set_b32(r, x_bin, overflow);
}